

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

void __thiscall
llvm::SMDiagnostic::SMDiagnostic
          (SMDiagnostic *this,SourceMgr *sm,SMLoc L,StringRef FN,int Line,int Col,DiagKind Kind,
          StringRef Msg,StringRef LineStr,ArrayRef<std::pair<unsigned_int,_unsigned_int>_> Ranges,
          ArrayRef<llvm::SMFixIt> Hints)

{
  SMFixIt *Start;
  void *pvVar1;
  iterator S;
  iterator E;
  size_t sVar2;
  int Line_local;
  SourceMgr *sm_local;
  SMDiagnostic *this_local;
  StringRef FN_local;
  SMLoc L_local;
  
  FN_local.Data = (char *)FN.Length;
  this_local = (SMDiagnostic *)FN.Data;
  this->SM = sm;
  (this->Loc).Ptr = L.Ptr;
  FN_local.Length = (size_t)L.Ptr;
  StringRef::operator_cast_to_string(&this->Filename,(StringRef *)&this_local);
  this->LineNo = Line;
  this->ColumnNo = Col;
  this->Kind = Kind;
  StringRef::operator_cast_to_string(&this->Message,&Msg);
  StringRef::operator_cast_to_string(&this->LineContents,&LineStr);
  ArrayRef<std::pair<unsigned_int,_unsigned_int>_>::vec(&this->Ranges,&Ranges);
  S = ArrayRef<llvm::SMFixIt>::begin(&Hints);
  E = ArrayRef<llvm::SMFixIt>::end(&Hints);
  SmallVector<llvm::SMFixIt,4u>::SmallVector<llvm::SMFixIt_const*,void>
            ((SmallVector<llvm::SMFixIt,4u> *)&this->FixIts,S,E);
  Start = (SMFixIt *)
          (this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
          super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
          super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
  pvVar1 = (this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
           super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
           super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)&this->FixIts);
  sort<llvm::SMFixIt*>(Start,(SMFixIt *)((long)pvVar1 + sVar2 * 0x30));
  return;
}

Assistant:

SMDiagnostic::SMDiagnostic(const SourceMgr &sm, SMLoc L, StringRef FN,
                           int Line, int Col, SourceMgr::DiagKind Kind,
                           StringRef Msg, StringRef LineStr,
                           ArrayRef<std::pair<unsigned,unsigned>> Ranges,
                           ArrayRef<SMFixIt> Hints)
  : SM(&sm), Loc(L), Filename(FN), LineNo(Line), ColumnNo(Col), Kind(Kind),
    Message(Msg), LineContents(LineStr), Ranges(Ranges.vec()),
    FixIts(Hints.begin(), Hints.end()) {
  llvm::sort(FixIts.begin(), FixIts.end());
}